

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_ver_2tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  __m128i res_00;
  __m128i res_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int in_EDX;
  int in_ESI;
  undefined8 *puVar3;
  uint *in_RDI;
  uint *puVar4;
  long in_R9;
  ulong uVar5;
  undefined8 uVar6;
  __m128i src;
  __m128i src_00;
  int in_stack_00000008;
  __m256i s_256_2 [2] [4];
  __m256i s_256_1 [2] [2];
  __m256i r_2 [4];
  __m256i s_256 [2];
  __m256i r_1 [2];
  __m128i s_128 [2];
  __m256i coeffs_256;
  __m128i rr;
  __m128i r [2];
  __m128i s_64 [2];
  __m128i res;
  __m128i s_32 [2];
  __m128i coeffs_128;
  int32_t y;
  int16_t *im;
  __m256i *in_stack_fffffffffffff940;
  __m256i *in_stack_fffffffffffff948;
  __m256i *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  int32_t in_stack_fffffffffffff95c;
  InterpFilterParams *in_stack_fffffffffffff960;
  longlong in_stack_fffffffffffff968;
  __m128i *in_stack_fffffffffffff970;
  __m256i *in_stack_fffffffffffff978;
  __m256i *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  int32_t in_stack_fffffffffffff98c;
  InterpFilterParams *in_stack_fffffffffffff990;
  uint8_t *in_stack_fffffffffffff998;
  __m256i *in_stack_fffffffffffff9a0;
  uint8_t *in_stack_fffffffffffff9c0;
  uint8_t *dst_00;
  __m256i *in_stack_fffffffffffff9c8;
  __m256i *coeffs;
  __m256i *in_stack_fffffffffffff9d0;
  __m256i *s1;
  __m256i *in_stack_fffffffffffff9d8;
  __m256i *s0;
  int16_t *in_stack_fffffffffffff9e0;
  int16_t *src_01;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  ulong local_1a0;
  undefined8 uStack_198;
  ulong local_190;
  undefined8 uStack_188;
  int local_154;
  uint *local_150;
  long local_148;
  int local_12c;
  undefined1 local_120 [16];
  uint local_104;
  uint *local_100;
  uint *local_f8;
  uint *local_f0;
  uint *local_e8;
  uint *local_e0;
  uint *local_d8;
  uint *local_d0;
  uint *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  uint *local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  
  local_154 = in_EDX;
  local_150 = in_RDI;
  local_148 = in_R9;
  local_12c = in_ESI;
  if (in_ESI < 5) {
    prepare_coeffs_2tap_sse2
              (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               (__m128i *)in_stack_fffffffffffff950);
    if (local_12c == 2) {
      local_104 = *local_150;
      local_120._4_4_ = 0;
      local_120._0_4_ = local_104;
      local_120._8_8_ = 0;
      local_190 = local_120._0_8_;
      uStack_188 = 0;
      uVar5 = local_120._0_8_;
      uVar6 = local_120._8_8_;
      local_120 = ZEXT416(local_104);
      do {
        xy_y_convolve_2tap_2x2_sse2
                  ((int16_t *)in_stack_fffffffffffff980,(__m128i *)in_stack_fffffffffffff978,
                   in_stack_fffffffffffff970);
        res_01[1] = (longlong)in_stack_fffffffffffff970;
        res_01[0] = in_stack_fffffffffffff968;
        local_1a0 = uVar5;
        uStack_198 = uVar6;
        xy_y_round_store_2x2_sse2
                  (res_01,(uint8_t *)in_stack_fffffffffffff960,
                   CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
        local_150 = local_150 + 2;
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
    else {
      local_b0 = local_150;
      local_1c0 = *(undefined8 *)local_150;
      uStack_b8 = 0;
      uStack_1b8 = 0;
      local_c0 = local_1c0;
      do {
        puVar3 = &local_1c0;
        puVar4 = local_150;
        xy_y_convolve_2tap_4x2_sse2
                  ((int16_t *)in_stack_fffffffffffff990,
                   (__m128i *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                   (__m128i *)in_stack_fffffffffffff980,(__m128i *)in_stack_fffffffffffff978);
        src[1] = (longlong)puVar3;
        src[0] = (longlong)puVar4;
        xy_y_round_sse2(src);
        src_00[1] = (longlong)puVar3;
        src_00[0] = (longlong)puVar4;
        xy_y_round_sse2(src_00);
        auVar2._8_8_ = uStack_1d8;
        auVar2._0_8_ = local_1e0;
        auVar1._8_8_ = uStack_1c8;
        auVar1._0_8_ = local_1d0;
        vpackssdw_avx(auVar2,auVar1);
        res_00[0]._4_4_ = in_stack_fffffffffffff95c;
        res_00[0]._0_4_ = in_stack_fffffffffffff958;
        res_00[1] = (longlong)in_stack_fffffffffffff960;
        pack_store_4x2_sse2(res_00,(uint8_t *)in_stack_fffffffffffff950,
                            (ptrdiff_t)in_stack_fffffffffffff948);
        local_150 = local_150 + 4;
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
  }
  else {
    prepare_coeffs_2tap_avx2
              (in_stack_fffffffffffff990,in_stack_fffffffffffff98c,in_stack_fffffffffffff980);
    if (local_12c == 8) {
      local_100 = local_150;
      do {
        xy_y_convolve_2tap_8x2_avx2
                  ((int16_t *)in_stack_fffffffffffff990,
                   (__m128i *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                   in_stack_fffffffffffff980,in_stack_fffffffffffff978);
        xy_y_round_store_8x2_avx2
                  (in_stack_fffffffffffff980,(uint8_t *)in_stack_fffffffffffff978,
                   (ptrdiff_t)in_stack_fffffffffffff970);
        local_150 = local_150 + 8;
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
    else if (local_12c == 0x10) {
      local_c8 = local_150;
      do {
        xy_y_convolve_2tap_16x2_avx2
                  ((int16_t *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                   in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940);
        xy_y_round_store_16x2_avx2
                  (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                   (ptrdiff_t)in_stack_fffffffffffff990);
        local_150 = local_150 + 0x10;
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
    else if (local_12c == 0x20) {
      local_d0 = local_150;
      local_d8 = local_150 + 8;
      do {
        xy_y_convolve_2tap_32_all_avx2
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        local_150 = local_150 + 0x20;
        xy_y_convolve_2tap_32_all_avx2
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
    else if (local_12c == 0x40) {
      local_e0 = local_150;
      local_e8 = local_150 + 8;
      local_f0 = local_150 + 0x10;
      local_f8 = local_150 + 0x18;
      do {
        xy_y_convolve_2tap_32_all_avx2
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        xy_y_convolve_2tap_32_all_avx2
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        local_150 = local_150 + 0x40;
        xy_y_convolve_2tap_32_all_avx2
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        xy_y_convolve_2tap_32_all_avx2
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                   in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
    else {
      local_98 = local_150;
      local_a0 = 0x10;
      local_58 = local_150;
      local_60 = local_150 + 8;
      local_68 = local_150 + 0x10;
      local_70 = local_150 + 0x18;
      local_78 = local_150 + 0x20;
      dst_00 = *(uint8_t **)local_78;
      coeffs = *(__m256i **)(local_150 + 0x22);
      s1 = *(__m256i **)(local_150 + 0x24);
      s0 = *(__m256i **)(local_150 + 0x26);
      local_80 = local_150 + 0x28;
      src_01 = *(int16_t **)local_80;
      local_88 = local_150 + 0x30;
      local_90 = local_150 + 0x38;
      local_a8 = &stack0xfffffffffffff940;
      do {
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        local_150 = local_150 + 0x80;
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        xy_y_convolve_2tap_32_all_avx2(src_01,s0,s1,coeffs,dst_00);
        local_148 = local_148 + (in_stack_00000008 << 1);
        local_154 = local_154 + -2;
      } while (local_154 != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_2tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  if (w <= 4) {
    __m128i coeffs_128;

    prepare_coeffs_2tap_sse2(filter_params_y, subpel_y_q4, &coeffs_128);

    if (w == 2) {
      __m128i s_32[2];

      s_32[0] = _mm_cvtsi32_si128(*(int32_t *)im);

      do {
        const __m128i res = xy_y_convolve_2tap_2x2_sse2(im, s_32, &coeffs_128);
        xy_y_round_store_2x2_sse2(res, dst, dst_stride);
        im += 2 * 2;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else {
      __m128i s_64[2], r[2];

      assert(w == 4);

      s_64[0] = _mm_loadl_epi64((__m128i *)im);

      do {
        xy_y_convolve_2tap_4x2_sse2(im, s_64, &coeffs_128, r);
        r[0] = xy_y_round_sse2(r[0]);
        r[1] = xy_y_round_sse2(r[1]);
        const __m128i rr = _mm_packs_epi32(r[0], r[1]);
        pack_store_4x2_sse2(rr, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256;

    prepare_coeffs_2tap_avx2(filter_params_y, subpel_y_q4, &coeffs_256);

    if (w == 8) {
      __m128i s_128[2];
      __m256i r[2];

      s_128[0] = _mm_loadu_si128((__m128i *)im);

      do {
        xy_y_convolve_2tap_8x2_avx2(im, s_128, &coeffs_256, r);
        xy_y_round_store_8x2_avx2(r, dst, dst_stride);
        im += 2 * 8;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      __m256i s_256[2], r[4];

      s_256[0] = _mm256_loadu_si256((__m256i *)im);

      do {
        xy_y_convolve_2tap_16x2_avx2(im, s_256, &coeffs_256, r);
        xy_y_round_store_16x2_avx2(r, dst, dst_stride);
        im += 2 * 16;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      __m256i s_256[2][2];

      s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[0], s_256[1], &coeffs_256,
                                       dst);
        im += 2 * 32;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1], s_256[0], &coeffs_256,
                                       dst + dst_stride);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 64) {
      __m256i s_256[2][4];

      s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[0][2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
      s_256[0][3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 64, s_256[0] + 0, s_256[1] + 0,
                                       &coeffs_256, dst);
        xy_y_convolve_2tap_32_all_avx2(im + 96, s_256[0] + 2, s_256[1] + 2,
                                       &coeffs_256, dst + 32);
        im += 2 * 64;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                       &coeffs_256, dst + dst_stride);
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[1] + 2, s_256[0] + 2,
                                       &coeffs_256, dst + dst_stride + 32);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else {
      __m256i s_256[2][8];

      assert(w == 128);

      load_16bit_8rows_avx2(im, 16, s_256[0]);

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 128, s_256[0] + 0, s_256[1] + 0,
                                       &coeffs_256, dst);
        xy_y_convolve_2tap_32_all_avx2(im + 160, s_256[0] + 2, s_256[1] + 2,
                                       &coeffs_256, dst + 1 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 192, s_256[0] + 4, s_256[1] + 4,
                                       &coeffs_256, dst + 2 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 224, s_256[0] + 6, s_256[1] + 6,
                                       &coeffs_256, dst + 3 * 32);
        im += 2 * 128;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                       &coeffs_256, dst + dst_stride);
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[1] + 2, s_256[0] + 2,
                                       &coeffs_256, dst + dst_stride + 1 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 64, s_256[1] + 4, s_256[0] + 4,
                                       &coeffs_256, dst + dst_stride + 2 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 96, s_256[1] + 6, s_256[0] + 6,
                                       &coeffs_256, dst + dst_stride + 3 * 32);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    }
  }
}